

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevII.cpp
# Opt level: O0

void __thiscall
Iir::ChebyshevII::BandStopBase::setup
          (BandStopBase *this,int order,double centerFrequency,double widthFrequency,
          double stopBandDb)

{
  Cascade *in_XMM1_Qa;
  LayoutBase *in_XMM2_Qa;
  LayoutBase *in_stack_000000a0;
  LayoutBase *in_stack_000000a8;
  double in_stack_000000b0;
  double in_stack_000000b8;
  BandStopTransform *in_stack_000000c0;
  
  AnalogLowPass::design((AnalogLowPass *)centerFrequency,widthFrequency._4_4_,stopBandDb);
  BandStopTransform::BandStopTransform
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
             in_stack_000000a0);
  Cascade::setLayout(in_XMM1_Qa,in_XMM2_Qa);
  return;
}

Assistant:

void BandStopBase::setup (int order,
                          double centerFrequency,
                          double widthFrequency,
                          double stopBandDb)
{
  m_analogProto.design (order, stopBandDb);

  BandStopTransform (centerFrequency,
                     widthFrequency,
                     m_digitalProto,
                     m_analogProto);

  Cascade::setLayout (m_digitalProto);
}